

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
::rebalance_or_split
          (btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           *this,iterator *iter)

{
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar1;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  bVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  bVar6;
  uint uVar7;
  int iVar8;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar9;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar10;
  long lVar11;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar12;
  uint uVar13;
  allocator_type *paVar14;
  MovableOnlyInstance **args;
  long lVar15;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
  *pbVar16;
  char *__function;
  allocator_type *extraout_RDX;
  long lVar17;
  allocator_type *extraout_RDX_00;
  int i;
  ulong uVar18;
  size_type sVar19;
  long lVar20;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  ulong uVar21;
  size_type n;
  iterator parent_iter;
  iterator local_40;
  
  pbVar9 = iter->node;
  if (((ulong)pbVar9 & 7) != 0) goto LAB_001b68a3;
  paVar14 = (allocator_type *)&DAT_00000064;
  if (pbVar9[0xb] !=
      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
       )0x0) {
    paVar14 = (allocator_type *)(ulong)(byte)pbVar9[0xb];
  }
  if (pbVar9[10] != SUB81(paVar14,0)) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  if (SUB81(paVar14,0) !=
      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
       )0x64) {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  pbVar12 = *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              **)pbVar9;
  if (pbVar9 == (this->root_).
                super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                .
                super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
                ._M_head_impl) {
    pbVar12 = new_internal_node(this,pbVar12);
    btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
    ::init_child(pbVar12,0,
                 (this->root_).
                 super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
                 ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>_*,_false>
    ._M_head_impl = pbVar12;
    pbVar9 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             ::child(pbVar12,0);
    if (((ulong)pbVar9 & 7) != 0) goto LAB_001b68a3;
    if ((pbVar9[0xb] !=
         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          )0x0) &&
       (pbVar9 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 ::child(pbVar12,0), pbVar9 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                   );
    }
    goto LAB_001b6439;
  }
  if ((ulong)(byte)pbVar9[8] == 0) goto LAB_001b6309;
  pbVar9 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           ::child(pbVar12,(ulong)(byte)pbVar9[8] - 1);
  if (((ulong)pbVar9 & 7) != 0) goto LAB_001b68a3;
  if ((pbVar9[0xb] !=
       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
        )0x0) &&
     (pbVar9[0xb] !=
      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
       )0x64)) {
    __assert_fail("left->max_count() == kNodeValues",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb5c,
                  "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                 );
  }
  bVar6 = pbVar9[10];
  if ((byte)bVar6 < 100) {
    iVar8 = iter->position;
    uVar7 = (int)(100 - (uint)(byte)bVar6) / (int)((iVar8 < 100) + 1);
    uVar18 = 1;
    if (1 < (int)uVar7) {
      uVar18 = (ulong)uVar7;
    }
    uVar13 = (uint)uVar18;
    uVar7 = (byte)bVar6 + uVar13;
    paVar14 = (allocator_type *)
              (ulong)CONCAT31((int3)(uVar7 >> 8),uVar7 < 100 || (int)uVar13 <= iVar8);
    if (uVar7 >= 100 && (int)uVar13 > iVar8) goto LAB_001b6309;
    pbVar12 = iter->node;
    if (((ulong)pbVar12 & 7) == 0) {
      uVar21 = *(ulong *)pbVar9;
      if (uVar21 != *(ulong *)pbVar12) {
        __assert_fail("parent() == right->parent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x87f,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar9[8] + 1 != (uint)(byte)pbVar12[8]) {
        __assert_fail("position() + 1 == right->position()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x880,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar12[10] < (byte)bVar6) {
        __assert_fail("right->count() >= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x881,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((byte)pbVar12[10] < uVar13) {
        __assert_fail("to_move <= right->count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x883,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if ((uVar21 & 7) == 0) {
        args = (MovableOnlyInstance **)((ulong)(byte)pbVar9[8] * 0x10);
        local_40.node =
             (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              *)((long)args + uVar21 + 0x10);
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
        ::value_init<phmap::test_internal::MovableOnlyInstance*>
                  ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                    *)pbVar9,(ulong)(byte)bVar6,(allocator_type *)&local_40,args);
        uVar21 = (ulong)(uVar13 - 1);
        btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
        ::uninitialized_move_n
                  (pbVar12,uVar21,0,(ulong)(byte)pbVar9[10] + 1,pbVar9,
                   (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
        if ((*(ulong *)pbVar9 & 7) == 0) {
          lVar15 = *(ulong *)pbVar9 + (ulong)(byte)pbVar9[8] * 0x10;
          uVar3 = *(undefined8 *)(pbVar12 + uVar21 * 0x10 + 0x10);
          *(undefined8 *)(lVar15 + 0x10) = uVar3;
          if (*(char *)(lVar15 + 0x18) == '\x01') {
            test_internal::BaseCountedInstance::num_live_instances_ =
                 test_internal::BaseCountedInstance::num_live_instances_ + -1;
          }
          paVar14 = (allocator_type *)
                    CONCAT71((int7)((ulong)uVar3 >> 8),pbVar12[uVar21 * 0x10 + 0x18]);
          *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            *)(lVar15 + 0x18) = pbVar12[uVar21 * 0x10 + 0x18];
          pbVar12[uVar21 * 0x10 + 0x18] =
               (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                )0x0;
          test_internal::BaseCountedInstance::num_moves_ =
               test_internal::BaseCountedInstance::num_moves_ + 1;
          if (uVar18 != (byte)pbVar12[10]) {
            pbVar16 = pbVar12 + 0x10;
            pbVar10 = pbVar16 + (ulong)(byte)pbVar12[10] * 0x10;
            paVar14 = (allocator_type *)(uVar18 * 0x10);
            do {
              *(undefined8 *)pbVar16 = *(undefined8 *)(pbVar16 + (long)paVar14);
              if (pbVar16[8] ==
                  (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                   )0x1) {
                test_internal::BaseCountedInstance::num_live_instances_ =
                     test_internal::BaseCountedInstance::num_live_instances_ + -1;
              }
              pbVar1 = pbVar16 + (long)paVar14;
              pbVar16[8] = pbVar1[8];
              pbVar1[8] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                           )0x0;
              test_internal::BaseCountedInstance::num_moves_ =
                   test_internal::BaseCountedInstance::num_moves_ + 1;
              pbVar16 = pbVar16 + 0x10;
            } while (pbVar1 + 0x10 != pbVar10);
          }
          bVar6 = pbVar12[10];
          lVar15 = -uVar18;
          do {
            btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            ::value_destroy(pbVar12,(ulong)(byte)bVar6 + lVar15,paVar14);
            lVar15 = lVar15 + 1;
            paVar14 = extraout_RDX;
          } while (lVar15 != 0);
          if (pbVar9[0xb] ==
              (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
               )0x0) {
            sVar19 = 0;
            do {
              bVar6 = pbVar9[10];
              uVar21 = sVar19 + 1;
              pbVar16 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        ::child(pbVar12,sVar19);
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::init_child(pbVar9,(int)sVar19 + (uint)(byte)bVar6 + 1,pbVar16);
              sVar19 = uVar21;
            } while (uVar18 != uVar21);
            if (uVar13 <= (byte)pbVar12[10]) {
              lVar15 = 0;
              do {
                sVar19 = uVar18 + lVar15;
                bVar6 = pbVar12[0xb];
                if (pbVar12[0xb] ==
                    (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x0) {
                  bVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                           )0x64;
                }
                if ((int)(uint)(byte)bVar6 < (int)sVar19) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                               );
                }
                pbVar16 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          ::child(pbVar12,sVar19);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::init_child(pbVar12,(int)lVar15,pbVar16);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::mutable_child(pbVar12,sVar19);
                bVar4 = lVar15 < (long)((ulong)(byte)pbVar12[10] - (long)(int)uVar13);
                lVar15 = lVar15 + 1;
              } while (bVar4);
            }
          }
          pbVar9[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )((char)pbVar9[10] + (char)uVar18);
          pbVar12[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )((char)pbVar12[10] - (char)uVar18);
          pbVar12 = iter->node;
          if (((ulong)pbVar12 & 7) == 0) {
            bVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x64;
            if (pbVar12[0xb] !=
                (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 )0x0) {
              bVar6 = pbVar12[0xb];
            }
            if ((uint)(byte)bVar6 - (uint)(byte)pbVar12[10] != uVar13) {
              __assert_fail("node->max_count() - node->count() == to_move",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb69,
                            "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            iVar8 = iter->position - uVar13;
            iter->position = iVar8;
            if (iVar8 < 0) {
              iter->position = iVar8 + (uint)(byte)pbVar9[10] + 1;
              iter->node = pbVar9;
            }
            pbVar9 = iter->node;
            if (((ulong)pbVar9 & 7) == 0) {
              bVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       )0x64;
              if (pbVar9[0xb] !=
                  (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                   )0x0) {
                bVar6 = pbVar9[0xb];
              }
              if ((byte)pbVar9[10] < (byte)bVar6) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
          }
          goto LAB_001b68a3;
        }
      }
      goto LAB_001b6950;
    }
LAB_001b6936:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  else {
LAB_001b6309:
    if ((((ulong)iter->node & 7) == 0) && (((ulong)pbVar12 & 7) == 0)) {
      bVar6 = iter->node[8];
      if ((byte)bVar6 < (byte)pbVar12[10]) {
        pbVar9 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                 ::child(pbVar12,(ulong)(byte)bVar6 + 1);
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001b68a3;
        if ((pbVar9[0xb] !=
             (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              )0x0) &&
           (pbVar9[0xb] !=
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             )0x64)) {
          __assert_fail("right->max_count() == kNodeValues",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xb79,
                        "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                       );
        }
        bVar6 = pbVar9[10];
        paVar14 = (allocator_type *)(ulong)(byte)bVar6;
        if ((byte)bVar6 < 100) {
          uVar7 = (int)(100 - (uint)(byte)bVar6) / (int)((0 < iter->position) + 1);
          sVar19 = 1;
          if (1 < (int)uVar7) {
            sVar19 = (size_type)uVar7;
          }
          pbVar16 = iter->node;
          if (((ulong)pbVar16 & 7) != 0) goto LAB_001b68a3;
          bVar2 = pbVar16[10];
          uVar7 = (uint)sVar19;
          if ((iter->position <= (int)((byte)bVar2 - uVar7)) || (uVar7 + (byte)bVar6 < 100)) {
            if (*(long *)pbVar16 != *(long *)pbVar9) {
              __assert_fail("parent() == right->parent()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ab,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)pbVar16[8] + 1 != (uint)(byte)pbVar9[8]) {
              __assert_fail("position() + 1 == right->position()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ac,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)bVar2 < (byte)bVar6) {
              __assert_fail("count() >= right->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8ad,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            if ((byte)bVar2 < uVar7) {
              __assert_fail("to_move <= count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x8af,
                            "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                           );
            }
            lVar15 = (long)(int)uVar7;
            if ((byte)bVar6 < uVar7) {
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::uninitialized_move_n
                        (pbVar9,(size_type)paVar14,0,sVar19,pbVar9,
                         (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
              if ((*(ulong *)pbVar16 & 7) == 0) {
                uVar18 = lVar15 - 1;
                local_40.node =
                     (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      *)((long)((ulong)(byte)pbVar16[8] * 0x10) + *(ulong *)pbVar16 + 0x10);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                ::value_init<phmap::test_internal::MovableOnlyInstance*>
                          ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,std::allocator<phmap::test_internal::MovableOnlyInstance>,1616,false>>
                            *)pbVar9,uVar18 & 0xffffffff,(allocator_type *)&local_40,
                           (MovableOnlyInstance **)((ulong)(byte)pbVar16[8] * 0x10));
                n = (size_type)(int)(~(uint)(byte)pbVar9[10] + uVar7);
                btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                ::uninitialized_move_n
                          (pbVar16,n,(byte)pbVar16[10] - n,(ulong)(byte)pbVar9[10],pbVar9,
                           (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
                if (n != uVar18) {
                  bVar6 = pbVar16[10];
                  lVar11 = ((byte)bVar6 - uVar18) * 0x10 + 0x10;
                  lVar20 = 0;
                  lVar17 = test_internal::BaseCountedInstance::num_live_instances_;
                  do {
                    test_internal::BaseCountedInstance::num_moves_ =
                         test_internal::BaseCountedInstance::num_moves_ + 1;
                    *(undefined8 *)(pbVar9 + lVar20 + 0x10) =
                         *(undefined8 *)(pbVar16 + lVar20 + lVar11);
                    if (pbVar9[lVar20 + 0x18] ==
                        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )0x1) {
                      lVar17 = lVar17 + -1;
                      test_internal::BaseCountedInstance::num_live_instances_ = lVar17;
                    }
                    lVar5 = lVar20 + lVar11;
                    pbVar9[lVar20 + 0x18] = pbVar16[lVar5 + 8];
                    pbVar16[lVar5 + 8] =
                         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          )0x0;
                    lVar20 = lVar20 + 0x10;
                  } while (pbVar16 + lVar5 + 0x10 != pbVar16 + ((byte)bVar6 - n) * 0x10 + 0x10);
                }
LAB_001b6748:
                if ((*(ulong *)pbVar16 & 7) == 0) {
                  lVar15 = (ulong)(byte)pbVar16[10] - lVar15;
                  lVar11 = *(ulong *)pbVar16 + (ulong)(byte)pbVar16[8] * 0x10;
                  uVar3 = *(undefined8 *)(pbVar16 + lVar15 * 0x10 + 0x10);
                  *(undefined8 *)(lVar11 + 0x10) = uVar3;
                  if (*(char *)(lVar11 + 0x18) == '\x01') {
                    test_internal::BaseCountedInstance::num_live_instances_ =
                         test_internal::BaseCountedInstance::num_live_instances_ + -1;
                  }
                  paVar14 = (allocator_type *)
                            CONCAT71((int7)((ulong)uVar3 >> 8),pbVar16[lVar15 * 0x10 + 0x18]);
                  *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    *)(lVar11 + 0x18) = pbVar16[lVar15 * 0x10 + 0x18];
                  pbVar16[lVar15 * 0x10 + 0x18] =
                       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )0x0;
                  test_internal::BaseCountedInstance::num_moves_ =
                       test_internal::BaseCountedInstance::num_moves_ + 1;
                  bVar6 = pbVar16[10];
                  lVar15 = -sVar19;
                  do {
                    btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    ::value_destroy(pbVar16,(ulong)(byte)bVar6 + lVar15,paVar14);
                    lVar15 = lVar15 + 1;
                    paVar14 = extraout_RDX_00;
                  } while (lVar15 != 0);
                  if (pbVar16[0xb] ==
                      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       )0x0) {
                    uVar18 = (ulong)(byte)pbVar9[10];
                    do {
                      pbVar12 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                ::child(pbVar9,uVar18);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::init_child(pbVar9,uVar7 + (int)uVar18,pbVar12);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::mutable_child(pbVar9,uVar18);
                      bVar4 = 0 < (long)uVar18;
                      uVar18 = uVar18 - 1;
                    } while (bVar4);
                    iVar8 = 1 - uVar7;
                    i = 0;
                    do {
                      pbVar12 = btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                ::child(pbVar16,(long)(int)((uint)(byte)pbVar16[10] + iVar8));
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::init_child(pbVar9,i,pbVar12);
                      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                      ::mutable_child(pbVar16,(long)(int)((uint)(byte)pbVar16[10] + iVar8));
                      iVar8 = iVar8 + 1;
                      i = i + 1;
                    } while (iVar8 != 1);
                  }
                  pbVar16[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                 )((char)pbVar16[10] - (char)sVar19);
                  pbVar9[10] = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                                )((char)pbVar9[10] + (char)sVar19);
                  if (((ulong)iter->node & 7) == 0) {
                    bVar6 = iter->node[10];
                    if ((int)(uint)(byte)bVar6 < iter->position) {
                      iter->position = iter->position + ~(uint)(byte)bVar6;
                      iter->node = pbVar9;
                    }
                    pbVar9 = iter->node;
                    if (((ulong)pbVar9 & 7) == 0) {
                      bVar6 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                               )0x64;
                      if (pbVar9[0xb] !=
                          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                           )0x0) {
                        bVar6 = pbVar9[0xb];
                      }
                      if ((byte)pbVar9[10] < (byte)bVar6) {
                        return;
                      }
                      __assert_fail("node->count() < node->max_count()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                    ,0xb8b,
                                    "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                                   );
                    }
                  }
                  goto LAB_001b68a3;
                }
              }
            }
            else {
              btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              ::uninitialized_move_n
                        (pbVar9,sVar19,(long)(int)((byte)bVar6 - uVar7),(size_type)paVar14,pbVar9,
                         (allocator_type *)CONCAT71(in_register_00000089,in_R9B));
              bVar6 = pbVar9[10];
              if ((uVar7 < (byte)bVar6) && (uVar13 = ~uVar7 + (uint)(byte)bVar6, -1 < (int)uVar13))
              {
                pbVar12 = pbVar9 + (ulong)(byte)bVar6 * 0x10;
                lVar11 = (ulong)uVar13 * 0x10 + 0x20;
                do {
                  *(undefined8 *)pbVar12 = *(undefined8 *)(pbVar9 + lVar11 + -0x10);
                  if (pbVar12[8] ==
                      (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       )0x1) {
                    test_internal::BaseCountedInstance::num_live_instances_ =
                         test_internal::BaseCountedInstance::num_live_instances_ + -1;
                  }
                  pbVar12[8] = pbVar9[lVar11 + -8];
                  pbVar9[lVar11 + -8] =
                       (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                        )0x0;
                  test_internal::BaseCountedInstance::num_moves_ =
                       test_internal::BaseCountedInstance::num_moves_ + 1;
                  pbVar12 = pbVar12 + -0x10;
                  lVar11 = lVar11 + -0x10;
                } while (0x1f < lVar11);
              }
              if ((*(ulong *)pbVar16 & 7) == 0) {
                lVar11 = *(ulong *)pbVar16 + (ulong)(byte)pbVar16[8] * 0x10;
                uVar18 = lVar15 - 1;
                lVar17 = (uVar18 & 0xffffffff) * 0x10;
                *(undefined8 *)(pbVar9 + lVar17 + 0x10) = *(undefined8 *)(lVar11 + 0x10);
                if (pbVar9[lVar17 + 0x18] ==
                    (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                     )0x1) {
                  test_internal::BaseCountedInstance::num_live_instances_ =
                       test_internal::BaseCountedInstance::num_live_instances_ + -1;
                }
                pbVar9[lVar17 + 0x18] =
                     *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                       *)(lVar11 + 0x18);
                *(undefined1 *)(lVar11 + 0x18) = 0;
                test_internal::BaseCountedInstance::num_moves_ =
                     test_internal::BaseCountedInstance::num_moves_ + 1;
                if (uVar18 != 0) {
                  bVar6 = pbVar16[10];
                  lVar11 = ((byte)bVar6 - uVar18) * 0x10 + 0x10;
                  lVar17 = 0;
                  do {
                    *(undefined8 *)(pbVar9 + lVar17 + 0x10) =
                         *(undefined8 *)(pbVar16 + lVar17 + lVar11);
                    if (pbVar9[lVar17 + 0x18] ==
                        (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                         )0x1) {
                      test_internal::BaseCountedInstance::num_live_instances_ =
                           test_internal::BaseCountedInstance::num_live_instances_ + -1;
                    }
                    lVar20 = lVar17 + lVar11;
                    pbVar9[lVar17 + 0x18] = pbVar16[lVar20 + 8];
                    pbVar16[lVar20 + 8] =
                         (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                          )0x0;
                    test_internal::BaseCountedInstance::num_moves_ =
                         test_internal::BaseCountedInstance::num_moves_ + 1;
                    lVar17 = lVar17 + 0x10;
                  } while (pbVar16 + lVar20 + 0x10 != pbVar16 + (ulong)(byte)bVar6 * 0x10 + 0x10);
                }
                goto LAB_001b6748;
              }
            }
LAB_001b6950:
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
            ;
            goto LAB_001b68b8;
          }
        }
      }
      if ((pbVar12[0xb] !=
           (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            )0x0) &&
         (pbVar12[0xb] !=
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           )0x64)) {
        __assert_fail("parent->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb93,
                      "void phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>]"
                     );
      }
      if (pbVar12[10] ==
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
           )0x64) {
        pbVar9 = iter->node;
        if (((ulong)pbVar9 & 7) != 0) goto LAB_001b6936;
        paVar14 = *(allocator_type **)pbVar9;
        local_40.position = (int)(byte)pbVar9[8];
        local_40.node =
             (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
              *)paVar14;
        rebalance_or_split(this,&local_40);
      }
LAB_001b6439:
      if (((ulong)iter->node & 7) == 0) {
        if (iter->node[0xb] ==
            (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
             )0x0) {
          pbVar9 = new_internal_node(this,pbVar12);
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::split(iter->node,iter->position,pbVar9,paVar14);
        }
        else {
          pbVar9 = (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
                    *)Allocate<8ul,std::allocator<phmap::test_internal::MovableOnlyInstance>>
                                ((allocator<phmap::test_internal::MovableOnlyInstance> *)this,0x650)
          ;
          if (((ulong)pbVar9 & 7) != 0) {
            __function = 
            "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
            ;
            goto LAB_001b68b8;
          }
          *(btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
            **)pbVar9 = pbVar12;
          *(undefined4 *)(pbVar9 + 8) = 0x64000000;
          btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_phmap::priv::(anonymous_namespace)::MovableOnlyInstanceThreeWayCompare,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_1616,_false>_>
          ::split(iter->node,iter->position,pbVar9,paVar14);
          if (this->rightmost_ == iter->node) {
            this->rightmost_ = pbVar9;
          }
        }
        if (((ulong)iter->node & 7) == 0) {
          bVar6 = iter->node[10];
          if ((int)(uint)(byte)bVar6 < iter->position) {
            iter->position = iter->position + ~(uint)(byte)bVar6;
            iter->node = pbVar9;
          }
          return;
        }
      }
    }
LAB_001b68a3:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *, unsigned char, phmap::test_internal::MovableOnlyInstance, phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, phmap::priv::(anonymous namespace)::MovableOnlyInstanceThreeWayCompare, std::allocator<phmap::test_internal::MovableOnlyInstance>, 1616, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
  }
LAB_001b68b8:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }